

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O1

void __thiscall
DebugAllocationTest_DeallocMismatch_Test::TestBody(DebugAllocationTest_DeallocMismatch_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  DeathTest *pDVar3;
  DeathTest *pDVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  StringLike<const_char_*> *regex_05;
  StringLike<const_char_*> *regex_06;
  StringLike<const_char_*> *regex_07;
  StringLike<const_char_*> *regex_08;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_160;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_148;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_118;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_100;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  AssertHelper local_40;
  DeathTest *local_38;
  DeathTest *gtest_dt;
  
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)malloc(4);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e0b7;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_160,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar6 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_160,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x42,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_160);
    pDVar3 = local_38;
    bVar5 = true;
    if (bVar6) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010af2a;
          bVar5 = true;
          bVar6 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5 && _Var1._M_head_impl !=
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0) {
              operator_delete(_Var1._M_head_impl,4);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010af2a:
          bVar5 = false;
          bVar6 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar6) goto LAB_0010af41;
      }
      bVar5 = false;
    }
LAB_0010af41:
    if (bVar5) goto LAB_0010af46;
  }
  else {
LAB_0010af46:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x42,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e14a;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_148,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar6 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_148,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x43,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_148);
    pDVar3 = local_38;
    bVar5 = true;
    if (bVar6) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010b09b;
          bVar5 = true;
          bVar6 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5 && _Var1._M_head_impl !=
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0) {
              operator_delete__(_Var1._M_head_impl);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010b09b:
          bVar5 = false;
          bVar6 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar6) goto LAB_0010b0b2;
      }
      bVar5 = false;
    }
LAB_0010b0b2:
    if (bVar5) goto LAB_0010b0b7;
  }
  else {
LAB_0010b0b7:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x43,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  free(_Var1._M_head_impl);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  (*noopt_helper)(&local_60);
  _Var2._M_head_impl = local_60._M_head_impl;
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e177;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_130,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_130,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x4c,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_130);
    pDVar3 = local_38;
    iVar7 = 6;
    if (bVar5) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010b24b;
          iVar7 = 6;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              free(_Var1._M_head_impl);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010b24b:
          iVar7 = 0;
          bVar5 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar5) goto LAB_0010b262;
      }
      iVar7 = 0;
    }
LAB_0010b262:
    if (iVar7 != 0) goto LAB_0010b267;
  }
  else {
LAB_0010b267:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x4c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e14a;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_118,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar6 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_118,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x4d,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_118);
    pDVar3 = local_38;
    bVar5 = true;
    if (bVar6) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010b3bf;
          bVar5 = true;
          bVar6 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5 && _Var1._M_head_impl !=
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0) {
              operator_delete__(_Var1._M_head_impl);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010b3bf:
          bVar5 = false;
          bVar6 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar6) goto LAB_0010b3d6;
      }
      bVar5 = false;
    }
LAB_0010b3d6:
    if (bVar5) goto LAB_0010b3db;
  }
  else {
LAB_0010b3db:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x4d,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (_Var1._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(_Var1._M_head_impl,4);
  }
  operator_delete(_Var2._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(4);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(4);
  (*noopt_helper)(&local_60);
  _Var2._M_head_impl = local_60._M_head_impl;
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e177;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_100,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_100,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x56,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_100);
    pDVar3 = local_38;
    iVar7 = 10;
    if (bVar5) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010b588;
          iVar7 = 10;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              free(_Var1._M_head_impl);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010b588:
          iVar7 = 0;
          bVar5 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar5) goto LAB_0010b59f;
      }
      iVar7 = 0;
    }
LAB_0010b59f:
    if (iVar7 != 0) goto LAB_0010b5a4;
  }
  else {
LAB_0010b5a4:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x56,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e0b7;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_e8,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_e8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x57,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_e8);
    pDVar3 = local_38;
    iVar7 = 0xc;
    if (bVar5) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010b701;
          iVar7 = 0xc;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5 && _Var1._M_head_impl !=
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0) {
              operator_delete(_Var1._M_head_impl,4);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010b701:
          iVar7 = 0;
          bVar5 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar5) goto LAB_0010b718;
      }
      iVar7 = 0;
    }
LAB_0010b718:
    if (iVar7 != 0) goto LAB_0010b71d;
  }
  else {
LAB_0010b71d:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x57,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (_Var1._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  operator_delete__(_Var2._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(&local_60);
  _Var2._M_head_impl = local_60._M_head_impl;
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e177;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_05);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_d0,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_d0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x60,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_d0);
    pDVar3 = local_38;
    iVar7 = 0xe;
    if (bVar5) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010b8ce;
          iVar7 = 0xe;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              free(_Var1._M_head_impl);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010b8ce:
          iVar7 = 0;
          bVar5 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar5) goto LAB_0010b8e5;
      }
      iVar7 = 0;
    }
LAB_0010b8e5:
    if (iVar7 != 0) goto LAB_0010b8ea;
  }
  else {
LAB_0010b8ea:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x60,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e14a;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_06);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_b8,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar6 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x61,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b8);
    pDVar3 = local_38;
    bVar5 = true;
    if (bVar6) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010ba42;
          bVar5 = true;
          bVar6 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5 && _Var1._M_head_impl !=
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0) {
              operator_delete__(_Var1._M_head_impl);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010ba42:
          bVar5 = false;
          bVar6 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar6) goto LAB_0010ba59;
      }
      bVar5 = false;
    }
LAB_0010ba59:
    if (bVar5) goto LAB_0010ba5e;
  }
  else {
LAB_0010ba5e:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x61,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (_Var1._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(_Var1._M_head_impl,4);
  }
  operator_delete(_Var2._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new__(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new__(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(&local_60);
  _Var2._M_head_impl = local_60._M_head_impl;
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e177;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_07);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a0,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x6a,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    pDVar3 = local_38;
    iVar7 = 0x12;
    if (bVar5) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*pDVar4->_vptr_DeathTest[4])(pDVar4,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010bc14;
          iVar7 = 0x12;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              free(_Var1._M_head_impl);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010bc14:
          iVar7 = 0;
          bVar5 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar5) goto LAB_0010bc2b;
      }
      iVar7 = 0;
    }
LAB_0010bc2b:
    if (iVar7 != 0) goto LAB_0010bc30;
  }
  else {
LAB_0010bc30:
    testing::Message::Message((Message *)&local_60);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x6a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_40.data_ = (AssertHelperData *)0x13e0b7;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_08);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_88,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x6b,&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_88);
    pDVar3 = local_38;
    iVar7 = 0x14;
    if (bVar5) {
      if (local_38 != (DeathTest *)0x0) {
        iVar7 = (*local_38->_vptr_DeathTest[2])(local_38);
        pDVar4 = local_38;
        if (iVar7 == 0) {
          iVar7 = (*local_38->_vptr_DeathTest[3])(local_38);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar7);
          iVar7 = (*local_38->_vptr_DeathTest[4])(local_38,(ulong)bVar5);
          if ((char)iVar7 != '\0') goto LAB_0010bd84;
          iVar7 = 0x14;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5 && _Var1._M_head_impl !=
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0) {
              operator_delete(_Var1._M_head_impl,4);
            }
            (*local_38->_vptr_DeathTest[5])(local_38,2);
            (*pDVar4->_vptr_DeathTest[5])(pDVar4,0);
          }
LAB_0010bd84:
          iVar7 = 0;
          bVar5 = true;
        }
        (*pDVar3->_vptr_DeathTest[1])(pDVar3);
        if (!bVar5) goto LAB_0010bd9b;
      }
      iVar7 = 0;
    }
LAB_0010bd9b:
    if (iVar7 == 0) goto LAB_0010bdf0;
  }
  testing::Message::Message((Message *)&local_60);
  pcVar8 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
             ,0x6b,pcVar8);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_60._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
LAB_0010bdf0:
  if (_Var1._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  operator_delete__(_Var2._M_head_impl,(nothrow_t *)&std::nothrow);
  return;
}

Assistant:

TEST(DebugAllocationTest, DeallocMismatch) {
  // malloc can be matched only by free
  // new can be matched only by delete and delete(nothrow)
  // new[] can be matched only by delete[] and delete[](nothrow)
  // new(nothrow) can be matched only by delete and delete(nothrow)
  // new(nothrow)[] can be matched only by delete[] and delete[](nothrow)

  // Allocate with malloc.
  {
    int* x = static_cast<int*>(noopt(malloc(sizeof(*x))));
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    // Should work fine.
    free(x);
  }

  // Allocate with new.
  {
    int* x = noopt(new int);
    int* y = noopt(new int);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    delete x;
    ::operator delete(y, std::nothrow);
  }

  // Allocate with new[].
  {
    int* x = noopt(new int[1]);
    int* y = noopt(new int[1]);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    delete [] x;
    ::operator delete[](y, std::nothrow);
  }

  // Allocate with new(nothrow).
  {
    int* x = noopt(new (std::nothrow) int);
    int* y = noopt(new (std::nothrow) int);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    delete x;
    ::operator delete(y, std::nothrow);
  }

  // Allocate with new(nothrow)[].
  {
    int* x = noopt(new (std::nothrow) int[1]);
    int* y = noopt(new (std::nothrow) int[1]);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    delete [] x;
    ::operator delete[](y, std::nothrow);
  }
}